

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

bool __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
::revalidate_if_necessary
          (iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
           *this,TreeIterator *it)

{
  bool bVar1;
  long *in_RDI;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  i;
  Node *l;
  size_type in_stack_ffffffffffffff38;
  InnerMap *in_stack_ffffffffffffff40;
  InnerMap *this_00;
  Node *in_stack_ffffffffffffff60;
  InnerMap *in_stack_ffffffffffffff68;
  InnerMap *in_stack_ffffffffffffff70;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair>
  local_88 [16];
  long local_78;
  long local_70;
  bool local_1;
  
  in_RDI[2] = *(long *)(in_RDI[1] + 8) - 1U & in_RDI[2];
  if (*(long *)(*(long *)(in_RDI[1] + 0x20) + in_RDI[2] * 8) == *in_RDI) {
    local_1 = true;
  }
  else {
    bVar1 = TableEntryIsNonEmptyList(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (bVar1) {
      local_70 = *(long *)(*(long *)(in_RDI[1] + 0x20) + in_RDI[2] * 8);
      do {
        local_70 = *(long *)(local_70 + 0x18);
        if (local_70 == 0) {
          local_70 = 0;
          goto LAB_0041ec4c;
        }
      } while (local_70 != *in_RDI);
      local_1 = true;
    }
    else {
LAB_0041ec4c:
      this_00 = (InnerMap *)in_RDI[1];
      KeyPtrFromNodePtr((Node *)0x41ec62);
      InnerMap::find(in_stack_ffffffffffffff70,(MapKey *)in_stack_ffffffffffffff68,
                     (TreeIterator *)in_stack_ffffffffffffff60);
      Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::
      iterator_base<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair>
      ::
      iterator_base<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair_const>
                (local_88,(iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                           *)&stack0xffffffffffffff60);
      in_RDI[2] = local_78;
      local_1 = TableEntryIsList(this_00,in_stack_ffffffffffffff38);
    }
  }
  return local_1;
}

Assistant:

bool revalidate_if_necessary(TreeIterator* it) {
        GOOGLE_DCHECK(node_ != NULL && m_ != NULL);
        // Force bucket_index_ to be in range.
        bucket_index_ &= (m_->num_buckets_ - 1);
        // Common case: the bucket we think is relevant points to node_.
        if (m_->table_[bucket_index_] == static_cast<void*>(node_)) return true;
        // Less common: the bucket is a linked list with node_ somewhere in it,
        // but not at the head.
        if (m_->TableEntryIsNonEmptyList(bucket_index_)) {
          Node* l = static_cast<Node*>(m_->table_[bucket_index_]);
          while ((l = l->next) != NULL) {
            if (l == node_) {
              return true;
            }
          }
        }
        // Well, bucket_index_ still might be correct, but probably
        // not.  Revalidate just to be sure.  This case is rare enough that we
        // don't worry about potential optimizations, such as having a custom
        // find-like method that compares Node* instead of const Key&.
        iterator_base i(m_->find(*KeyPtrFromNodePtr(node_), it));
        bucket_index_ = i.bucket_index_;
        return m_->TableEntryIsList(bucket_index_);
      }